

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::DataTypeExpression::fromSyntax
          (Compilation *compilation,DataTypeSyntax *syntax,ASTContext *context)

{
  SourceRange sourceRange;
  bool bVar1;
  Type *this;
  SourceRange *args_1;
  long in_RDX;
  int *in_RSI;
  Type *in_RDI;
  Type *type;
  Type *in_stack_ffffffffffffff48;
  Compilation *in_stack_ffffffffffffff50;
  SourceRange *in_stack_ffffffffffffff58;
  Compilation *in_stack_ffffffffffffff60;
  Type *in_stack_ffffffffffffff68;
  SourceLocation in_stack_ffffffffffffff70;
  SourceLocation in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  DiagCode code;
  bool local_71;
  SyntaxNode *in_stack_ffffffffffffffa0;
  bitmask<slang::ast::ASTFlags> local_48;
  SourceRange local_40;
  bitmask<slang::ast::ASTFlags> local_30;
  Type *local_28;
  long local_20;
  int *local_18;
  Type *local_10;
  TypeReferenceExpression *local_8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff80 >> 0x20,0);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = Compilation::getType
                       (in_stack_ffffffffffffff60,(DataTypeSyntax *)in_stack_ffffffffffffff58,
                        (ASTContext *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_71 = false;
  if (*local_18 == 0x1dc) {
    code = SUB84((ulong)(local_20 + 0x10) >> 0x20,0);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_30,AllowTypeReferences);
    local_71 = bitmask<slang::ast::ASTFlags>::has
                         ((bitmask<slang::ast::ASTFlags> *)in_stack_ffffffffffffff60,
                          (bitmask<slang::ast::ASTFlags> *)in_stack_ffffffffffffff58);
  }
  if (local_71 == false) {
    args_1 = (SourceRange *)(local_20 + 0x10);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_48,AllowDataType);
    bVar1 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)args_1,
                       (bitmask<slang::ast::ASTFlags> *)in_stack_ffffffffffffff58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffffa0);
      local_8 = (TypeReferenceExpression *)
                BumpAllocator::
                emplace<slang::ast::DataTypeExpression,slang::ast::Type_const&,slang::SourceRange>
                          ((BumpAllocator *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                           args_1);
    }
    else {
      slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffffa0);
      sourceRange.endLoc = in_stack_ffffffffffffff78;
      sourceRange.startLoc = in_stack_ffffffffffffff70;
      ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff68,code,sourceRange);
      local_8 = (TypeReferenceExpression *)
                Expression::badExpr(in_stack_ffffffffffffff50,
                                    (Expression *)in_stack_ffffffffffffff48);
    }
  }
  else {
    this = Compilation::getTypeRefType((Compilation *)0xb9171b);
    local_40 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffffa0);
    local_8 = BumpAllocator::
              emplace<slang::ast::TypeReferenceExpression,slang::ast::Type_const&,slang::ast::Type_const&,slang::SourceRange>
                        ((BumpAllocator *)this,local_10,(Type *)in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffff58);
  }
  return &local_8->super_Expression;
}

Assistant:

Expression& DataTypeExpression::fromSyntax(Compilation& compilation, const DataTypeSyntax& syntax,
                                           const ASTContext& context) {
    const Type& type = compilation.getType(syntax, context);
    if (syntax.kind == SyntaxKind::TypeReference &&
        context.flags.has(ASTFlags::AllowTypeReferences)) {
        return *compilation.emplace<TypeReferenceExpression>(compilation.getTypeRefType(), type,
                                                             syntax.sourceRange());
    }

    if (!context.flags.has(ASTFlags::AllowDataType)) {
        context.addDiag(diag::ExpectedExpression, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    return *compilation.emplace<DataTypeExpression>(type, syntax.sourceRange());
}